

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterWriteIndent(xmlTextWriterPtr writer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = xmlListSize(writer->nodes);
  if (iVar1 < 1) {
LAB_001b2db5:
    iVar2 = -1;
  }
  else {
    iVar2 = 0;
    if (iVar1 != 1) {
      iVar2 = iVar1 + -1;
      iVar1 = iVar2;
      do {
        iVar3 = xmlOutputBufferWriteString(writer->out,(char *)writer->ichar);
        if (iVar3 == -1) goto LAB_001b2db5;
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
  }
  return iVar2;
}

Assistant:

static int
xmlTextWriterWriteIndent(xmlTextWriterPtr writer)
{
    int lksize;
    int i;
    int ret;

    lksize = xmlListSize(writer->nodes);
    if (lksize < 1)
        return (-1);            /* list is empty */
    for (i = 0; i < (lksize - 1); i++) {
        ret = xmlOutputBufferWriteString(writer->out,
                                         (const char *) writer->ichar);
        if (ret == -1)
            return (-1);
    }

    return (lksize - 1);
}